

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

void __thiscall libchars::commands::add_commands_from_set(commands *this,command_set *C_set)

{
  _Rb_tree<libchars::command*,libchars::command*,std::_Identity<libchars::command*>,libchars::command_sort_criteria,std::allocator<libchars::command*>>
  *this_00;
  debug *this_01;
  token *word;
  command_node *this_02;
  command_node *this_03;
  command *pcVar1;
  double __x;
  _Head_base<0UL,_libchars::token_*,_false> local_48;
  unique_ptr<libchars::token,_std::default_delete<libchars::token>_> Tadd;
  command *local_38;
  command *cmd;
  
  pcVar1 = (command *)0x0;
  this_01 = debug::initialize(0);
  Tadd._M_t.super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>._M_t.
  super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>.
  super__Head_base<0UL,_libchars::token_*,_false>._M_head_impl =
       (__uniq_ptr_data<libchars::token,_std::default_delete<libchars::token>,_true,_true>)
       (__uniq_ptr_data<libchars::token,_std::default_delete<libchars::token>,_true,_true>)this;
  debug::log(this_01,__x);
  if (C_set->active != false) {
    pcVar1 = C_set->C_list;
  }
  this_00 = (_Rb_tree<libchars::command*,libchars::command*,std::_Identity<libchars::command*>,libchars::command_sort_criteria,std::allocator<libchars::command*>>
             *)((long)Tadd._M_t.
                      super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>
                      .super__Head_base<0UL,_libchars::token_*,_false>._M_head_impl + 0x4080);
  local_38 = pcVar1;
  while( true ) {
    if (local_38 == (command *)0x0) {
      return;
    }
    pcVar1 = local_38->next;
    word = libchars::lexer(&local_38->cmd_str);
    local_48._M_head_impl = word;
    if (word != (token *)0x0) break;
LAB_00111b15:
    std::unique_ptr<libchars::token,_std::default_delete<libchars::token>_>::~unique_ptr
              ((unique_ptr<libchars::token,_std::default_delete<libchars::token>_> *)&local_48);
    local_38 = pcVar1;
  }
  this_02 = command_node::add(&this->root,&word->value,local_38->mask,local_38->hidden);
  do {
    word = word->next;
    do {
      if ((this_02 == (command_node *)0x0) || (word == (token *)0x0)) {
        if (this_02 != (command_node *)0x0) {
          *(undefined1 *)
           ((long)Tadd._M_t.
                  super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>._M_t
                  .super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>.
                  super__Head_base<0UL,_libchars::token_*,_false>._M_head_impl + 0x415c) = 1;
          command_node::associate(this_02,local_38);
          std::
          _Rb_tree<libchars::command*,libchars::command*,std::_Identity<libchars::command*>,libchars::command_sort_criteria,std::allocator<libchars::command*>>
          ::_M_insert_unique<libchars::command*const&>(this_00,&local_38);
        }
        goto LAB_00111b15;
      }
      this_03 = command_node::add_root(this_02,local_38->mask,local_38->hidden);
      this_02 = (command_node *)0x0;
    } while (this_03 == (command_node *)0x0);
    this_02 = command_node::add(this_03,&word->value,local_38->mask,local_38->hidden);
  } while( true );
}

Assistant:

void commands::add_commands_from_set(command_set &C_set)
    {
        LC_LOG_VERBOSE("set[%p] root[%p]",&C_set,&root);
        command *C_list = C_set.get();
        while (C_list != NULL) {
            command *cmd = C_list;
            C_list = C_list->next;
            // break command string into tokens
            std::unique_ptr<token> Tadd(libchars::lexer(cmd->cmd_str));
            if (Tadd.get() == NULL)
                continue;
            // add command word(s) to dictionary
            token *T = Tadd.get();
            command_node *cnode = root.add(T->value,cmd->mask,cmd->hidden);
            T = T->next;
            while (T != NULL && cnode != NULL) {
                if ((cnode = cnode->add_root(cmd->mask,cmd->hidden)) != NULL) {
                    cnode = cnode->add(T->value,cmd->mask,cmd->hidden);
                    T = T->next;
                }
            }
            // associate dictionary node with command
            if (cnode != NULL) {
                dirty = true;
                cnode->associate(cmd);
                C_sorted.insert(cmd);
            }
        }
    }